

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

json_handler_t * __thiscall
anon_unknown.dwarf_311d49::Handlers::bindJSON
          (json_handler_t *__return_storage_ptr__,Handlers *this,offset_in_Handlers_to_subr f)

{
  offset_in_Handlers_to_subr in_RCX;
  Handlers *local_78;
  offset_in_Handlers_to_subr local_70;
  _Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)> local_60;
  type local_50;
  offset_in_Handlers_to_subr local_38;
  offset_in_Handlers_to_subr f_local;
  Handlers *local_28;
  Handlers *this_local;
  json_handler_t *local_10;
  
  local_70 = f;
  local_38 = f;
  local_28 = this;
  this_local = (Handlers *)f;
  local_10 = __return_storage_ptr__;
  local_60.super__Mem_fn_base<void_((anonymous_namespace)::Handlers::*)(JSON),_true>._M_pmf =
       (offset_in_Handlers_to_subr)
       std::mem_fn<void(JSON),(anonymous_namespace)::Handlers>
                 ((_Mem_fn<void_((anonymous_namespace)::Handlers::*)(JSON)> *)f,in_RCX);
  local_78 = this;
  std::
  bind<std::_Mem_fn<void((anonymous_namespace)::Handlers::*)(JSON)>,(anonymous_namespace)::Handlers*,std::_Placeholder<1>const&>
            (&local_50,&local_60,&local_78,(_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(JSON)>::
  function<std::_Bind<std::_Mem_fn<void((anonymous_namespace)::Handlers::*)(JSON)>((anonymous_namespace)::Handlers*,std::_Placeholder<1>)>,void>
            ((function<void(JSON)> *)__return_storage_ptr__,&local_50);
  return __return_storage_ptr__;
}

Assistant:

Handlers::json_handler_t
Handlers::bindJSON(void (Handlers::*f)(JSON))
{
    return std::bind(std::mem_fn(f), this, std::placeholders::_1);
}